

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::SparseDSATextureCommitmentTestCase::iterate(SparseDSATextureCommitmentTestCase *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  ostream *poVar7;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  uint uVar8;
  uint *puVar9;
  uint *puVar10;
  GLuint texture;
  undefined1 local_1f4 [4];
  long local_1f0;
  uint *local_1e8;
  string *local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  ostream *local_1b8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar6;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_SparseTextureCommitmentTestCase).super_TestCase.m_context)->
                     m_contextInfo,"GL_ARB_sparse_texture");
  if (bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_SparseTextureCommitmentTestCase).super_TestCase.m_context)->
                       m_contextInfo,"GL_EXT_direct_state_access");
    if (bVar1) {
      iVar2 = (*((this->super_SparseTextureCommitmentTestCase).super_TestCase.m_context)->
                m_renderCtx->_vptr_RenderContext[3])();
      lVar6 = CONCAT44(extraout_var,iVar2);
      puVar9 = (uint *)(this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
      if (puVar9 != (uint *)(this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish) {
        local_1e0 = (string *)&(this->super_SparseTextureCommitmentTestCase).field_0x90;
        local_1b8 = (ostream *)&(this->super_SparseTextureCommitmentTestCase).field_0x88;
        local_1f0 = lVar6;
        do {
          puVar10 = (uint *)(this->super_SparseTextureCommitmentTestCase).mSupportedInternalFormats.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
          local_1e8 = puVar9;
          if (puVar10 !=
              (uint *)(this->super_SparseTextureCommitmentTestCase).mSupportedInternalFormats.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish) {
            do {
              local_1b0._0_8_ = local_1a0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1af8059);
              std::__cxx11::stringbuf::str(local_1e0);
              if ((TestLog *)local_1b0._0_8_ != local_1a0) {
                operator_delete((void *)local_1b0._0_8_,
                                (ulong)((long)&(local_1a0[0].m_log)->flags + 1));
              }
              poVar7 = local_1b8;
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1b8,"Testing DSA sparse texture commitment for target: ",0x32);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*puVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", format: ",10);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*puVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
              (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                super_TestNode._vptr_TestNode[8])
                        (this,lVar6,(ulong)*puVar9,(ulong)*puVar10,local_1f4,3);
              if (0 < (this->super_SparseTextureCommitmentTestCase).mState.levels) {
                uVar4 = 1;
                iVar2 = 1;
                do {
                  uVar8 = iVar2 - 1;
                  iVar3 = (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.
                            super_TestCase.super_TestNode._vptr_TestNode[0xc])
                                    (this,local_1f0,(ulong)*local_1e8,(ulong)*puVar10,local_1f4,
                                     (ulong)uVar8);
                  puVar9 = local_1e8;
                  lVar6 = local_1f0;
                  if ((char)iVar3 != '\0') {
                    (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[10])
                              (this,local_1f0,(ulong)*local_1e8,(ulong)*puVar10,local_1f4,
                               (ulong)uVar8);
                    uVar4 = (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.
                              super_TestCase.super_TestNode._vptr_TestNode[0xb])
                                      (this,lVar6,(ulong)*puVar9,(ulong)*puVar10,local_1f4,
                                       (ulong)uVar8);
                  }
                  lVar6 = local_1f0;
                } while (((uVar4 & 1) != 0) &&
                        (bVar1 = iVar2 < (this->super_SparseTextureCommitmentTestCase).mState.levels
                        , iVar2 = iVar2 + 1, bVar1));
                (**(code **)(local_1f0 + 0x480))(1,local_1f4);
                dVar5 = (**(code **)(lVar6 + 0x800))();
                glu::checkError(dVar5,"GenTextures",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                                ,0xd4);
                puVar9 = local_1e8;
                if ((uVar4 & 1) != 0) goto LAB_00a607ea;
LAB_00a6088e:
                local_1b0._0_8_ =
                     ((this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log;
                this_00 = (ostringstream *)(local_1b0 + 8);
                std::__cxx11::ostringstream::ostringstream(this_00);
                std::__cxx11::stringbuf::str();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00,(char *)local_1d8,local_1d0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Fail",4);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                if (local_1d8 != local_1c8) {
                  operator_delete(local_1d8,local_1c8[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream(this_00);
                std::ios_base::~ios_base(local_138);
                this_01 = (this->super_SparseTextureCommitmentTestCase).super_TestCase.
                          super_TestCase.super_TestNode.m_testCtx;
                description = "Fail";
                testResult = QP_TEST_RESULT_FAIL;
                goto LAB_00a60875;
              }
              (**(code **)(lVar6 + 0x480))(1,local_1f4);
              dVar5 = (**(code **)(lVar6 + 0x800))();
              glu::checkError(dVar5,"GenTextures",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                              ,0xd4);
LAB_00a607ea:
              iVar2 = (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                        super_TestNode._vptr_TestNode[0xf])
                                (this,lVar6,(ulong)*puVar9,(ulong)*puVar10,local_1f4);
              if (((char)iVar2 == '\0') ||
                 (iVar2 = (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.
                            super_TestCase.super_TestNode._vptr_TestNode[0x10])
                                    (this,lVar6,(ulong)*puVar9,(ulong)*puVar10,local_1f4),
                 (char)iVar2 == '\0')) goto LAB_00a6088e;
              puVar10 = puVar10 + 1;
            } while (puVar10 !=
                     (uint *)(this->super_SparseTextureCommitmentTestCase).mSupportedInternalFormats
                             .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish);
          }
          puVar9 = puVar9 + 1;
        } while (puVar9 != (uint *)(this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish);
      }
      this_01 = (this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00a60875;
    }
    this_01 = (this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    description = "GL_EXT_direct_state_access extension is not supported.";
  }
  else {
    this_01 = (this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    description = "Not Supported";
  }
  testResult = QP_TEST_RESULT_NOT_SUPPORTED;
LAB_00a60875:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseDSATextureCommitmentTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_direct_state_access"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_EXT_direct_state_access extension is not supported.");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			mLog.str("");
			mLog << "Testing DSA sparse texture commitment for target: " << target << ", format: " << format << " - ";

			//Checking if written data into committed region is as expected
			sparseAllocateTexture(gl, target, format, texture, 3);
			for (int l = 0; l < mState.levels; ++l)
			{
				if (commitTexturePage(gl, target, format, texture, l))
				{
					writeDataToTexture(gl, target, format, texture, l);
					result = verifyTextureData(gl, target, format, texture, l);
				}

				if (!result)
					break;
			}

			Texture::Delete(gl, texture);

			//verify errors
			result = result && verifyInvalidOperationErrors(gl, target, format, texture);
			result = result && verifyInvalidValueErrors(gl, target, format, texture);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}